

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::readLevel(PtexReader *this,int levelid,Level **level)

{
  uint32_t uVar1;
  pointer pLVar2;
  pointer pFVar3;
  pointer plVar4;
  pointer pFVar5;
  Level *this_00;
  FaceDataHeader *pFVar6;
  long lVar7;
  long lVar8;
  pointer pFVar9;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->readlock);
  if (*level == (Level *)0x0) {
    pLVar2 = (this->_levelinfo).
             super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this_00 = (Level *)operator_new(0x48);
    Level::Level(this_00,pLVar2[levelid].nfaces);
    seek(this,(this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[levelid]);
    readZipBlock(this,(this_00->fdh).
                      super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                      ._M_impl.super__Vector_impl_data._M_start,pLVar2[levelid].levelheadersize,
                 pLVar2[levelid].nfaces << 2);
    uVar1 = pLVar2[levelid].nfaces;
    pFVar3 = (this_00->fdh).
             super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar4 = (this_00->offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(int)uVar1 != 0) {
      lVar7 = this->_pos;
      lVar8 = 0;
      pFVar9 = pFVar3;
      do {
        *(long *)((long)plVar4 + lVar8) = lVar7;
        lVar7 = lVar7 + (ulong)(pFVar9->data & 0x3fffffff);
        pFVar9 = pFVar9 + 1;
        lVar8 = lVar8 + 8;
      } while ((long)(int)uVar1 * 8 != lVar8);
    }
    if (levelid == 0) {
      pFVar5 = (this->_faceedits).
               super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)(this->_faceedits).
                    super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5;
      if (lVar7 != 0) {
        lVar7 = lVar7 >> 4;
        lVar7 = lVar7 + (ulong)(lVar7 == 0);
        pFVar6 = &pFVar5->fdh;
        do {
          pFVar3[*(int *)(pFVar6 + -1)].data = pFVar6->data;
          plVar4[*(int *)(pFVar6 + -1)] = ((FaceEdit *)(pFVar6 + -3))->pos;
          pFVar6 = pFVar6 + 4;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
    }
    *level = this_00;
    lVar7 = ((ulong)((long)(this_00->fdh).
                           super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->fdh).
                          super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x14 + 0x48;
    if (lVar7 != 0) {
      LOCK();
      this->_memUsed = this->_memUsed + lVar7;
      UNLOCK();
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->readlock);
  return;
}

Assistant:

void PtexReader::readLevel(int levelid, Level*& level)
{
    // get read lock and make sure we still need to read
    AutoMutex locker(readlock);
    if (level) {
        return;
    }

    // go ahead and read the level
    LevelInfo& l = _levelinfo[levelid];

    // keep new level local until finished
    Level* newlevel = new Level(l.nfaces);
    seek(_levelpos[levelid]);
    readZipBlock(&newlevel->fdh[0], l.levelheadersize, FaceDataHeaderSize * l.nfaces);
    computeOffsets(tell(), l.nfaces, &newlevel->fdh[0], &newlevel->offsets[0]);

    // apply edits (if any) to level 0
    if (levelid == 0) {
        for (size_t i = 0, size = _faceedits.size(); i < size; i++) {
            FaceEdit& e = _faceedits[i];
            newlevel->fdh[e.faceid] = e.fdh;
            newlevel->offsets[e.faceid] = e.pos;
        }
    }

    // don't assign to result until level data is fully initialized
    AtomicStore(&level, newlevel);
    increaseMemUsed(level->memUsed());
}